

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Combine<duckdb::QuantileState<float,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  vector<float,std::allocator<float>> *pvVar4;
  idx_t iVar5;
  
  if (count != 0) {
    lVar1 = *(long *)(source + 0x20);
    lVar2 = *(long *)(target + 0x20);
    iVar5 = 0;
    do {
      plVar3 = *(long **)(lVar1 + iVar5 * 8);
      if (*plVar3 != plVar3[1]) {
        pvVar4 = *(vector<float,std::allocator<float>> **)(lVar2 + iVar5 * 8);
        std::vector<float,std::allocator<float>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                  (pvVar4,*(undefined8 *)(pvVar4 + 8));
      }
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}